

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_countSeqStoreLiteralsBytes(seqStore_t *seqStore)

{
  seqDef seq;
  size_t i;
  size_t nbSeqs;
  size_t literalsBytes;
  seqStore_t *seqStore_local;
  
  literalsBytes = 0;
  for (i = 0; i < (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      i = i + 1) {
    literalsBytes = ((ulong)seqStore->sequencesStart[i] >> 0x20 & 0xffff) + literalsBytes;
    if ((i == seqStore->longLengthPos) && (seqStore->longLengthType == ZSTD_llt_literalLength)) {
      literalsBytes = literalsBytes + 0x10000;
    }
  }
  return literalsBytes;
}

Assistant:

static size_t ZSTD_countSeqStoreLiteralsBytes(const seqStore_t* const seqStore)
{
    size_t literalsBytes = 0;
    size_t const nbSeqs = (size_t)(seqStore->sequences - seqStore->sequencesStart);
    size_t i;
    for (i = 0; i < nbSeqs; ++i) {
        seqDef const seq = seqStore->sequencesStart[i];
        literalsBytes += seq.litLength;
        if (i == seqStore->longLengthPos && seqStore->longLengthType == ZSTD_llt_literalLength) {
            literalsBytes += 0x10000;
    }   }
    return literalsBytes;
}